

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op,
          BaseType input_type,BaseType expected_result_type)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool forwarding;
  SPIRType *pSVar1;
  SPIRType *pSVar2;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  string local_300;
  string local_2e0;
  string local_2c0 [32];
  string local_2a0 [32];
  undefined1 local_280 [8];
  string expr;
  string local_240;
  string local_220;
  spirv_cross local_1f0 [32];
  string local_1d0;
  string local_1b0 [8];
  string cast_op;
  SPIRType expected_type;
  SPIRType *expr_type;
  SPIRType *out_type;
  char *pcStack_28;
  BaseType input_type_local;
  char *op_local;
  uint32_t local_18;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,input_type);
  pcStack_28 = op;
  op_local._4_4_ = op0;
  local_18 = result_id;
  op0_local = result_type;
  _result_id_local = this;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op_local._4_4_);
  SPIRType::SPIRType((SPIRType *)((long)&cast_op.field_2 + 8),pSVar1);
  ::std::__cxx11::string::string(local_1b0);
  if (pSVar2->basetype == input_type) {
    to_unpacked_expression_abi_cxx11_((string *)((long)&expr.field_2 + 8),this,op_local._4_4_,true);
    ::std::__cxx11::string::operator=(local_1b0,(string *)(expr.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(expr.field_2._M_local_buf + 8));
  }
  else if (pSVar2->basetype == Boolean) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])
              (local_1f0,this,(undefined1 *)((long)&cast_op.field_2 + 8),0);
    to_unpacked_expression_abi_cxx11_(&local_220,this,op_local._4_4_,true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&local_1d0,local_1f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
               (char (*) [2])&local_220,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,ts_3);
    ::std::__cxx11::string::operator=(local_1b0,(string *)&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)local_1f0);
  }
  else {
    bitcast_glsl_abi_cxx11_(&local_240,this,(SPIRType *)((long)&cast_op.field_2 + 8),op_local._4_4_)
    ;
    ::std::__cxx11::string::operator=(local_1b0,(string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_240);
  }
  ::std::__cxx11::string::string((string *)local_280);
  if (pSVar1->basetype == expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_300,(spirv_cross *)&stack0xffffffffffffffd8,(char **)0x4a488c,
               (char (*) [2])local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,ts_3);
    ::std::__cxx11::string::operator+=((string *)local_280,(string *)&local_300);
    ::std::__cxx11::string::~string((string *)&local_300);
  }
  else {
    if (pSVar1->basetype == Boolean) {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_2a0,this,pSVar1,0);
      ::std::__cxx11::string::operator=((string *)local_280,local_2a0);
      ::std::__cxx11::string::~string(local_2a0);
    }
    else {
      (*(this->super_Compiler)._vptr_Compiler[0x3b])
                (local_2c0,this,pSVar1,(undefined1 *)((long)&cast_op.field_2 + 8));
      ::std::__cxx11::string::operator=((string *)local_280,local_2c0);
      ::std::__cxx11::string::~string(local_2c0);
    }
    ::std::__cxx11::string::operator+=((string *)local_280,'(');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_2e0,(spirv_cross *)&stack0xffffffffffffffd8,(char **)0x4a488c,
               (char (*) [2])local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,ts_3);
    ::std::__cxx11::string::operator+=((string *)local_280,(string *)&local_2e0);
    ::std::__cxx11::string::~string((string *)&local_2e0);
    ::std::__cxx11::string::operator+=((string *)local_280,')');
  }
  result_type_00 = op0_local;
  result_id_00 = local_18;
  forwarding = should_forward(this,op_local._4_4_);
  emit_op(this,result_type_00,result_id_00,(string *)local_280,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,local_18,op_local._4_4_);
  ::std::__cxx11::string::~string((string *)local_280);
  ::std::__cxx11::string::~string(local_1b0);
  SPIRType::~SPIRType((SPIRType *)((long)&cast_op.field_2 + 8));
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op,
                                           SPIRType::BaseType input_type, SPIRType::BaseType expected_result_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);
	auto expected_type = out_type;

	// Bit-widths might be different in unary cases because we use it for SConvert/UConvert and friends.
	expected_type.basetype = input_type;
	expected_type.width = expr_type.width;

	string cast_op;
	if (expr_type.basetype != input_type)
	{
		if (expr_type.basetype == SPIRType::Boolean)
			cast_op = join(type_to_glsl(expected_type), "(", to_unpacked_expression(op0), ")");
		else
			cast_op = bitcast_glsl(expected_type, op0);
	}
	else
		cast_op = to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.basetype = expected_result_type;
		expected_type.width = out_type.width;
		if (out_type.basetype == SPIRType::Boolean)
			expr = type_to_glsl(out_type);
		else
			expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}